

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsproto.c
# Opt level: O0

void * expand_buffer(lua_State *L,int osz,int nsz)

{
  void *output;
  int nsz_local;
  int osz_local;
  lua_State *L_local;
  
  output._4_4_ = osz;
  do {
    output._4_4_ = output._4_4_ << 1;
  } while (output._4_4_ < nsz);
  if (output._4_4_ < 0x1000001) {
    L_local = (lua_State *)lua_newuserdata(L,(long)output._4_4_);
    lua_copy(L,-1,-0xf4629);
    lua_settop(L,-2);
    lua_pushinteger(L,(long)output._4_4_);
    lua_copy(L,-1,-0xf462a);
    lua_settop(L,-2);
  }
  else {
    luaL_error(L,"object is too large (>%d)",0x1000000);
    L_local = (lua_State *)0x0;
  }
  return L_local;
}

Assistant:

static void *
expand_buffer(lua_State *L, int osz, int nsz) {
	void *output;
	do {
		osz *= 2;
	} while (osz < nsz);
	if (osz > ENCODE_MAXSIZE) {
		luaL_error(L, "object is too large (>%d)", ENCODE_MAXSIZE);
		return NULL;
	}
	output = lua_newuserdata(L, osz);
	lua_replace(L, lua_upvalueindex(1));
	lua_pushinteger(L, osz);
	lua_replace(L, lua_upvalueindex(2));

	return output;
}